

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausRunSat(Clu_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Cnf_Dat_t *pCVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  lit *begin;
  long lVar8;
  
  uVar1 = p->nFrames;
  begin = (lit *)malloc((long)(int)uVar1 * 4 + 4);
  pVVar2 = p->pAig->vCos;
  if (pVVar2->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (-1 < (int)uVar1) {
    pvVar3 = *pVVar2->pArray;
    pCVar4 = p->pCnf;
    piVar5 = pCVar4->pVarNums;
    lVar8 = 0;
    do {
      *(uint *)((long)begin + lVar8 * 2) =
           ((uint)((ulong)uVar1 * 2 != lVar8) | pCVar4->nVars * (int)lVar8) +
           piVar5[*(int *)((long)pvVar3 + 0x24)] * 2;
      lVar8 = lVar8 + 2;
    } while ((ulong)uVar1 * 2 + 2 != lVar8);
  }
  iVar6 = sat_solver_solve(p->pSatMain,begin,begin + (long)(int)uVar1 + 1,(long)p->nBTLimit,0,0,0);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  iVar7 = 1;
  if (iVar6 != -1) {
    if (iVar6 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                    ,0x8a,"int Fra_ClausRunSat(Clu_Man_t *)");
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Fra_ClausRunSat( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int * pLits;
    int i, RetValue;
    pLits = ABC_ALLOC( int, p->nFrames + 1 );
    // set the output literals
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i <= p->nFrames; i++ )
        pLits[i] = i * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObj->Id], i != p->nFrames ); 
    // try to solve the problem
    RetValue = sat_solver_solve( p->pSatMain, pLits, pLits + p->nFrames + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    ABC_FREE( pLits );
    if ( RetValue == l_False )
        return 1;
    // get the counter-example
    assert( RetValue == l_True );
    return 0;
}